

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64.hpp
# Opt level: O0

void __thiscall trng::lcg64::split(lcg64 *this,uint s,uint n)

{
  result_type rVar1;
  undefined8 extraout_RAX;
  uint in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  double __x;
  double in_XMM1_Qa;
  lcg64 *in_stack_ffffffffffffffc0;
  lcg64 *in_stack_ffffffffffffffd0;
  result_type in_stack_ffffffffffffffd8;
  lcg64 local_20;
  
  local_20.S.r._4_4_ = in_ESI;
  if ((in_ESI == 0) || (in_ESI <= in_EDX)) {
    in_stack_ffffffffffffffc0 = &local_20;
    std::invalid_argument::invalid_argument
              ((invalid_argument *)in_stack_ffffffffffffffc0,
               "invalid argument for trng::lcg64::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)in_stack_ffffffffffffffc0);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_20);
  }
  if (1 < local_20.S.r._4_4_) {
    jump(in_stack_ffffffffffffffd0,(unsigned_long_long)in_RDI);
    rVar1 = f(in_stack_ffffffffffffffd8,(result_type)in_stack_ffffffffffffffd0);
    in_RDI[1] = rVar1 * in_RDI[1];
    pow(__x,in_XMM1_Qa);
    *in_RDI = extraout_RAX;
    backward(in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void lcg64::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::lcg64::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      P.b *= f(s, P.a);
      P.a = pow(P.a, s);
      backward();
    }
  }